

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

void Jf_ObjComputeBestCut(Jf_Man_t *p,Gia_Obj_t *pObj,int fEdge,int fEla)

{
  word *pwVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  word wVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  word *pwVar18;
  word *pCut;
  word *pwVar19;
  word *__src;
  float fVar20;
  float fVar21;
  float fVar22;
  int local_58;
  
  pGVar3 = p->pGia->pObjs;
  if ((pObj < pGVar3) || (pGVar3 + p->pGia->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar17 = (int)((long)pObj - (long)pGVar3 >> 2) * -0x55555555;
  if ((-1 < (int)uVar17) && ((int)uVar17 < (p->vCuts).nSize)) {
    uVar11 = uVar17 & 0x7fffffff;
    uVar12 = (p->vCuts).pArray[uVar11];
    pwVar18 = (p->pMem).pPages[(int)uVar12 >> ((byte)(p->pMem).nPageSize & 0x1f)];
    lVar9 = (long)(int)(uVar12 & (p->pMem).uPageMask);
    pwVar1 = pwVar18 + lVar9;
    pwVar18 = (word *)((long)pwVar18 + lVar9 * 8 + 4);
    local_58 = 1000000000;
    iVar14 = 0;
    iVar8 = 1000000000;
    pCut = pwVar18;
    pwVar19 = (word *)0x0;
    fVar21 = 1e+09;
    do {
      uVar12 = (uint)*pCut & 0xf;
      if (uVar12 == 1) {
        if ((int)*(uint *)((long)pCut + 4) < 0) goto LAB_0075b7ba;
        __src = pwVar19;
        fVar22 = fVar21;
        iVar7 = local_58;
        if (*(uint *)((long)pCut + 4) >> 1 != uVar17) goto LAB_0075b4c0;
      }
      else {
LAB_0075b4c0:
        if (fEla == 0 && fEdge != 0) {
          *(uint *)pCut = (uint)*pCut & 0xffffff0f | uVar12 << 4;
        }
        if (fEla == 0) {
          uVar12 = (uint)*pCut;
          if ((uVar12 & 0xf) == 0) {
            fVar20 = 0.0;
          }
          else {
            fVar20 = 0.0;
            uVar13 = 0;
            do {
              uVar15 = *(uint *)((long)pCut + uVar13 * 4 + 4);
              if ((int)uVar15 < 0) goto LAB_0075b7ba;
              uVar15 = uVar15 >> 1;
              if ((p->vFlow).nSize <= (int)uVar15) goto LAB_0075b7d9;
              fVar20 = fVar20 + (p->vFlow).pArray[uVar15];
              uVar13 = uVar13 + 1;
            } while ((uVar12 & 0xf) != uVar13);
          }
          if (fVar20 < 0.0) {
            __assert_fail("Flow >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                          ,0x21b,"float Jf_CutFlow(Jf_Man_t *, int *)");
          }
          fVar20 = fVar20 + (float)(uVar12 >> 4 & 0xf);
        }
        else {
          p->vTemp->nSize = 0;
          if (fEdge == 0) {
            iVar7 = Jf_CutAreaRef_rec(p,(int *)pCut);
          }
          else {
            iVar7 = Jf_CutAreaRefEdge_rec(p,(int *)pCut);
          }
          pVVar4 = p->vTemp;
          if (0 < pVVar4->nSize) {
            piVar10 = pVVar4->pArray;
            piVar5 = p->pGia->pRefs;
            lVar9 = 0;
            do {
              piVar2 = piVar5 + piVar10[lVar9];
              *piVar2 = *piVar2 + -1;
              lVar9 = lVar9 + 1;
            } while (lVar9 < pVVar4->nSize);
          }
          fVar20 = (float)iVar7;
        }
        __src = pCut;
        fVar22 = fVar20;
        iVar7 = iVar8;
        if (((pwVar19 != (word *)0x0) && (fVar21 <= fVar20 + 0.005)) &&
           (__src = pwVar19, fVar22 = fVar21, iVar7 = local_58, fVar20 + -0.005 < fVar21)) {
          if (((uint)*pCut & 0xf) == 0) {
            iVar8 = 1;
          }
          else {
            uVar13 = 0;
            iVar8 = 0;
            do {
              uVar12 = *(uint *)((long)pCut + uVar13 * 4 + 4);
              if ((int)uVar12 < 0) goto LAB_0075b7ba;
              uVar12 = uVar12 >> 1;
              if ((p->vArr).nSize <= (int)uVar12) goto LAB_0075b7f8;
              iVar7 = (p->vArr).pArray[uVar12];
              if (iVar8 <= iVar7) {
                iVar8 = iVar7;
              }
              uVar13 = uVar13 + 1;
            } while (((uint)*pCut & 0xf) != uVar13);
            iVar8 = iVar8 + 1;
          }
          __src = pCut;
          fVar22 = fVar20;
          iVar7 = iVar8;
          if (local_58 <= iVar8) {
            __src = pwVar19;
            fVar22 = fVar21;
            iVar7 = local_58;
          }
        }
      }
      local_58 = iVar7;
      iVar14 = iVar14 + 1;
      pCut = (word *)((long)pCut + (ulong)((uint)*pCut & 0xf) * 4 + 4);
      pwVar19 = __src;
      fVar21 = fVar22;
    } while (iVar14 < (int)(uint)*pwVar1);
    if (((uint)*__src & 0xf) == 0) {
      iVar8 = 1;
    }
    else {
      uVar13 = 0;
      iVar8 = 0;
      do {
        uVar12 = *(uint *)((long)__src + uVar13 * 4 + 4);
        if ((int)uVar12 < 0) {
LAB_0075b7ba:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar12 = uVar12 >> 1;
        if ((p->vArr).nSize <= (int)uVar12) goto LAB_0075b7f8;
        iVar14 = (p->vArr).pArray[uVar12];
        if (iVar8 <= iVar14) {
          iVar8 = iVar14;
        }
        uVar13 = uVar13 + 1;
      } while (((uint)*__src & 0xf) != uVar13);
      iVar8 = iVar8 + 1;
    }
    if ((p->vArr).nSize <= (int)uVar17) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (p->vArr).pArray[uVar11] = iVar8;
    if (fEla == 0) {
      if ((p->vRefs).nSize <= (int)uVar17) {
LAB_0075b7d9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      if ((p->vFlow).nSize <= (int)uVar17) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                      ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
      }
      (p->vFlow).pArray[uVar11] = fVar22 / (p->vRefs).pArray[uVar11];
    }
    if (__src <= pwVar1) {
      __assert_fail("pCuts < pCut",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                    ,0x1ff,"void Jf_ObjSetBestCut(int *, int *, Vec_Int_t *)");
    }
    if (__src <= pwVar18) {
      return;
    }
    pVVar4 = p->vTemp;
    uVar13 = (long)__src - (long)pwVar18;
    wVar6 = *__src;
    iVar8 = (int)(uVar13 >> 2);
    if (pVVar4->nCap < iVar8) {
      uVar16 = (long)(uVar13 * 0x40000000) >> 0x1e & 0xfffffffffffffffc;
      if (pVVar4->pArray == (int *)0x0) {
        piVar10 = (int *)malloc(uVar16);
      }
      else {
        piVar10 = (int *)realloc(pVVar4->pArray,uVar16);
      }
      pVVar4->pArray = piVar10;
      if (piVar10 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar4->nCap = iVar8;
    }
    uVar16 = (long)(uVar13 * 0x40000000) >> 0x1e & 0xfffffffffffffffc;
    memmove(pVVar4->pArray,pwVar18,uVar16);
    uVar13 = (ulong)((((uint)wVar6 & 0xf) + 1) * 4);
    memmove(pwVar18,__src,uVar13);
    memmove((void *)((long)pwVar18 + uVar13),pVVar4->pArray,uVar16);
    return;
  }
LAB_0075b7f8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Jf_ObjComputeBestCut( Jf_Man_t * p, Gia_Obj_t * pObj, int fEdge, int fEla )
{
    int i, iObj = Gia_ObjId( p->pGia, pObj );
    int * pCuts = Jf_ObjCuts( p, iObj );
    int * pCut, * pCutBest = NULL;
    int Time = ABC_INFINITY, TimeBest = ABC_INFINITY;
    float Area, AreaBest = ABC_INFINITY;
    Jf_ObjForEachCut( pCuts, pCut, i )
    {
        if ( Jf_CutIsTriv(pCut, iObj) ) continue;
        if ( fEdge && !fEla ) 
            Jf_CutSetCost(pCut, Jf_CutSize(pCut));
        Area = fEla ? Jf_CutArea(p, pCut, fEdge) : Jf_CutFlow(p, pCut) + Jf_CutCost(pCut);
        if ( pCutBest == NULL || AreaBest > Area + JF_EPSILON || (AreaBest > Area - JF_EPSILON && TimeBest > (Time = Jf_CutArr(p, pCut))) )
            pCutBest = pCut, AreaBest = Area, TimeBest = Time;
    }
    Vec_IntWriteEntry( &p->vArr,  iObj, Jf_CutArr(p, pCutBest) );
    if ( !fEla )
    Vec_FltWriteEntry( &p->vFlow, iObj, AreaBest / Jf_ObjRefs(p, iObj) );
    Jf_ObjSetBestCut( pCuts, pCutBest, p->vTemp );
//    Jf_CutPrint( Jf_ObjCutBest(p, iObj) ); printf( "\n" );
}